

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O1

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_b1e20::BuildManifestActions::readFile
          (BuildManifestActions *this,StringRef path,StringRef forFilename,Token *forToken)

{
  StringRef message;
  ManifestLoaderActions MVar1;
  Parser *parser;
  char *pcVar2;
  StringRef filename;
  StringRef filename_00;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EVar3;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  string error;
  ManifestLoaderActions local_68;
  byte local_60;
  string local_58;
  ulong local_38;
  
  pcVar2 = path.Data;
  filename.Length = path.Length;
  filename.Data = (char *)&local_68;
  EVar3 = llbuild::commands::util::readFileContents(filename);
  MVar1._vptr_ManifestLoaderActions = local_68._vptr_ManifestLoaderActions;
  if ((local_60 & 1) == 0) {
    (this->super_ManifestLoaderActions)._vptr_ManifestLoaderActions =
         local_68._vptr_ManifestLoaderActions;
    local_68._vptr_ManifestLoaderActions = (_func_int **)0x0;
  }
  else {
    local_68._vptr_ManifestLoaderActions = (_func_int **)0x0;
    local_38 = (ulong)MVar1._vptr_ManifestLoaderActions | 1;
    llvm::toString_abi_cxx11_(&local_58,(llvm *)&local_38,EVar3._8_8_);
    if ((long *)(local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
    }
    *(int *)(pcVar2 + 0x18) = *(int *)(pcVar2 + 0x18) + 1;
    if (bufferOrError._8_8_ == 0) {
      BuildContext::emitError(*(BuildContext **)(pcVar2 + 8),&local_58);
    }
    else {
      message.Length = local_58._M_string_length;
      message.Data = local_58._M_dataplus._M_p;
      parser = llbuild::ninja::ManifestLoader::getCurrentParser(*(ManifestLoader **)(pcVar2 + 0x10))
      ;
      filename_00.Length = (size_t)forToken;
      filename_00.Data = (char *)forFilename.Length;
      llbuild::commands::util::emitError(filename_00,message,(Token *)bufferOrError._8_8_,parser);
    }
    (this->super_ManifestLoaderActions)._vptr_ManifestLoaderActions = (_func_int **)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68._vptr_ManifestLoaderActions != (_func_int **)0x0) {
    (**(code **)(*local_68._vptr_ManifestLoaderActions + 8))();
  }
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer> readFile(
      StringRef path, StringRef forFilename,
      const ninja::Token* forToken) override {
    auto bufferOrError = util::readFileContents(path);
    if (bufferOrError)
      return std::move(*bufferOrError);

    // TODO: util::emitError doesn't use the console queue?
    std::string error = llvm::toString(bufferOrError.takeError());
    ++numErrors;
    if (forToken) {
      util::emitError(forFilename, error, *forToken,
                      loader->getCurrentParser());
    } else {
      context.emitError(std::move(error));
    }
    return nullptr;
  }